

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O3

DWORD __thiscall TSparseArray::FindGroup_Items0(TSparseArray *this,DWORD index)

{
  uint *puVar1;
  uint uVar2;
  char *__function;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  _BASEVALS *p_Var6;
  
  uVar3 = index >> 9;
  uVar2 = (this->IndexToItem0).ItemCount;
  if ((uVar3 < uVar2) && (uVar3 + 1 < uVar2)) {
    puVar1 = (this->IndexToItem0).ItemArray;
    uVar2 = puVar1[uVar3];
    uVar5 = uVar2 >> 9;
    uVar3 = puVar1[uVar3 + 1] + 0x1ff >> 9;
    if (uVar3 - uVar5 < 10) {
      uVar4 = (ulong)(uVar2 >> 9);
      uVar5 = (uVar2 >> 9) - 1;
      uVar2 = uVar2 & 0xfffffe00;
      p_Var6 = (this->BaseVals).ItemArray + uVar4;
      do {
        uVar4 = uVar4 + 1;
        p_Var6 = p_Var6 + 1;
        if ((this->BaseVals).ItemCount <= uVar4) goto LAB_00117a16;
        uVar2 = uVar2 + 0x200;
        uVar5 = uVar5 + 1;
      } while (uVar2 - p_Var6->BaseValue200 <= index);
    }
    else if (uVar5 + 1 < uVar3) {
      do {
        if ((this->BaseVals).ItemCount <= uVar3) goto LAB_00117a16;
        uVar2 = uVar5 + uVar3 >> 1;
        if (index < uVar3 * 0x200 - (this->BaseVals).ItemArray[uVar3].BaseValue200) {
          uVar3 = uVar2;
          uVar2 = uVar5;
        }
        uVar5 = uVar2;
      } while (uVar5 + 1 < uVar3);
    }
    return uVar5;
  }
  __function = "T &TGenericArray<unsigned int>::operator[](size_t) [T = unsigned int]";
LAB_00117a2b:
  __assert_fail("index < ItemCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                ,0x1d0,__function);
LAB_00117a16:
  __function = "T &TGenericArray<_BASEVALS>::operator[](size_t) [T = _BASEVALS]";
  goto LAB_00117a2b;
}

Assistant:

DWORD FindGroup_Items0(DWORD index)
    {
        // Setup the group range to search
        DWORD minGroup = (IndexToItem0[INDEX_TO_GROUP(index) + 0]) >> 9;
        DWORD maxGroup = (IndexToItem0[INDEX_TO_GROUP(index) + 1] + 0x1FF) >> 9;

        // Search the groups and find the BASEVALS structure
        // For spans less than 10 groups, use sequential search, otherwise binary search.
        if ((maxGroup - minGroup) < 10)
        {
            // HOTS: 1959CF7
            while (index >= GROUP_TO_INDEX(minGroup) - BaseVals[minGroup + 1].BaseValue200 + 0x200)
            {
                // HOTS: 1959D14
                minGroup++;
            }
        }
        else
        {
            // HOTS: 1959D2E
            while ((minGroup + 1) < maxGroup)
            {
                // HOTS: 1959D38
                DWORD middleValue = (maxGroup + minGroup) >> 1;

                if (index < (maxGroup << 0x09) - BaseVals[maxGroup].BaseValue200)
                {
                    // HOTS: 01959D4B
                    maxGroup = middleValue;
                }
                else
                {
                    // HOTS: 1959D50
                    minGroup = middleValue;
                }
            }
        }

        return minGroup;
    }